

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_tec_vol_zone(REF_GRID ref_grid,FILE *file)

{
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node_per;
  REF_INT group;
  REF_INT nnode;
  REF_INT cell;
  REF_INT brick [27];
  REF_INT nodes [27];
  REF_INT *n2o;
  REF_INT *o2n;
  REF_CELL pRStack_30;
  REF_INT node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  FILE *file_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_private_macro_code_rss = 8;
  pRStack_30 = ref_grid->cell[8];
  do {
    if (0xf < ref_private_macro_code_rss) {
      return 0;
    }
    if (0 < pRStack_30->n) {
      uVar3 = pRStack_30->node_per;
      if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x2ac,"ref_export_tec_vol_zone","malloc o2n of REF_INT negative");
        return 1;
      }
      __ptr = malloc((long)pRVar1->max << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x2ac,"ref_export_tec_vol_zone","malloc o2n of REF_INT NULL");
        return 2;
      }
      for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
        *(undefined4 *)((long)__ptr + (long)o2n._4_4_ * 4) = 0xffffffff;
      }
      node_per = 0;
      for (group = 0; group < pRStack_30->max; group = group + 1) {
        RVar2 = ref_cell_nodes(pRStack_30,group,brick + 0x1a);
        if (RVar2 == 0) {
          for (o2n._4_4_ = 0; o2n._4_4_ < (int)uVar3; o2n._4_4_ = o2n._4_4_ + 1) {
            if (*(int *)((long)__ptr + (long)brick[(long)o2n._4_4_ + 0x1a] * 4) == -1) {
              *(REF_INT *)((long)__ptr + (long)brick[(long)o2n._4_4_ + 0x1a] * 4) = node_per;
              node_per = node_per + 1;
            }
          }
        }
      }
      node_per = 0;
      for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
        if (*(int *)((long)__ptr + (long)o2n._4_4_ * 4) != -1) {
          *(REF_INT *)((long)__ptr + (long)o2n._4_4_ * 4) = node_per;
          node_per = node_per + 1;
        }
      }
      if (node_per < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x2c3,"ref_export_tec_vol_zone","malloc n2o of REF_INT negative");
        return 1;
      }
      __ptr_00 = malloc((long)node_per << 2);
      if (__ptr_00 == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
               0x2c3,"ref_export_tec_vol_zone","malloc n2o of REF_INT NULL");
        return 2;
      }
      for (o2n._4_4_ = 0; o2n._4_4_ < pRVar1->max; o2n._4_4_ = o2n._4_4_ + 1) {
        if (*(int *)((long)__ptr + (long)o2n._4_4_ * 4) != -1) {
          *(int *)((long)__ptr_00 + (long)*(int *)((long)__ptr + (long)o2n._4_4_ * 4) * 4) =
               o2n._4_4_;
        }
      }
      fprintf((FILE *)file,"zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)uVar3,(ulong)(uint)node_per,(ulong)(uint)pRStack_30->n,"point","febrick");
      for (o2n._4_4_ = 0; o2n._4_4_ < node_per; o2n._4_4_ = o2n._4_4_ + 1) {
        fprintf((FILE *)file," %.16e %.16e %.16e\n",
                pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf],
                pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 1],
                pRVar1->real[*(int *)((long)__ptr_00 + (long)o2n._4_4_ * 4) * 0xf + 2]);
      }
      for (group = 0; group < pRStack_30->max; group = group + 1) {
        RVar2 = ref_cell_nodes(pRStack_30,group,brick + 0x1a);
        if (RVar2 == 0) {
          uVar3 = pRStack_30->node_per - 4;
          if (3 < uVar3 && pRStack_30->node_per != 8) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c"
                   ,0x2e2,"ref_export_tec_vol_zone",6,"wrong nodes per cell");
            return 6;
          }
          RVar2 = (*(code *)(&DAT_002e8fe0 + *(int *)(&DAT_002e8fe0 + (ulong)uVar3 * 4)))();
          return RVar2;
        }
      }
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
    pRStack_30 = ref_grid->cell[ref_private_macro_code_rss];
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_export_tec_vol_zone(REF_GRID ref_grid,
                                                  FILE *file) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT *o2n, *n2o;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT brick[REF_CELL_MAX_SIZE_PER];
  REF_INT cell;
  REF_INT nnode;
  REF_INT group, node_per;

  ref_node = ref_grid_node(ref_grid);

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    if (ref_cell_n(ref_cell) > 0) {
      node_per = ref_cell_node_per(ref_cell);

      ref_malloc(o2n, ref_node_max(ref_node), REF_INT);

      for (node = 0; node < ref_node_max(ref_node); node++)
        o2n[node] = REF_EMPTY;

      /* mark nodes needed by this element type */
      nnode = 0;
      each_ref_cell_valid_cell_with_nodes(
          ref_cell, cell,
          nodes) for (node = 0; node < node_per;
                      node++) if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }

      /* retain node numbering if grid is compact and single element type */
      nnode = 0;
      for (node = 0; node < ref_node_max(ref_node); node++)
        if (REF_EMPTY != o2n[node]) {
          o2n[node] = nnode;
          nnode++;
        }

      ref_malloc(n2o, nnode, REF_INT);

      for (node = 0; node < ref_node_max(ref_node); node++)
        if (REF_EMPTY != o2n[node]) n2o[o2n[node]] = node;

      fprintf(file,
              "zone t=\"e%d\", nodes=%d, elements=%d, datapacking=%s, "
              "zonetype=%s\n",
              node_per, nnode, ref_cell_n(ref_cell), "point", "febrick");

      for (node = 0; node < nnode; node++)
        fprintf(file, " %.16e %.16e %.16e\n",
                ref_node_xyz(ref_node, 0, n2o[node]),
                ref_node_xyz(ref_node, 1, n2o[node]),
                ref_node_xyz(ref_node, 2, n2o[node]));

      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_node_per(ref_cell)) {
          case 4:
            REF_CELL_TEC_BRICK_TET(brick, nodes);
            break;
          case 5:
            REF_CELL_TEC_BRICK_PYR(brick, nodes);
            break;
          case 6:
            REF_CELL_TEC_BRICK_PRI(brick, nodes);
            break;
          case 8:
            REF_CELL_TEC_BRICK_HEX(brick, nodes);
            break;
          default:
            RSS(REF_IMPLEMENT, "wrong nodes per cell");
            break;
        }

        for (node = 0; node < 8; node++) {
          fprintf(file, " %d", o2n[brick[node]] + 1);
        }
        fprintf(file, "\n");
      }

      ref_free(n2o);
      ref_free(o2n);
    }
  }

  return REF_SUCCESS;
}